

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# option.cpp
# Opt level: O0

bool __thiscall pstore::command_line::option::is_satisfied(option *this)

{
  uint uVar1;
  bool local_11;
  bool result;
  option *this_local;
  
  local_11 = true;
  uVar1 = (*this->_vptr_option[3])();
  if (1 < uVar1) {
    if (uVar1 == 2) {
      local_11 = this->num_occurrences_ != 0;
    }
    else if (uVar1 == 3) {
      local_11 = 1 < this->num_occurrences_;
    }
  }
  return local_11;
}

Assistant:

bool option::is_satisfied () const {
                bool result = true;
                switch (this->get_num_occurrences_flag ()) {
                case num_occurrences_flag::required: result = num_occurrences_ >= 1U; break;
                case num_occurrences_flag::one_or_more: result = num_occurrences_ > 1U; break;
                case num_occurrences_flag::optional:
                case num_occurrences_flag::zero_or_more: break;
                }
                return result;
            }